

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef52::EAXReverb_setParami(EffectProps *props,ALenum param,int val)

{
  effect_exception *peVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  
  if (in_ESI != 0x17) {
    peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (peVar1,0xa002,"Invalid EAX reverb integer property 0x%04x",(ulong)in_ESI);
    __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  if ((-1 < in_EDX) && (in_EDX < 2)) {
    *(bool *)(in_RDI + 0x30) = in_EDX != 0;
    return;
  }
  peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception(peVar1,0xa003,"EAX Reverb decay hflimit out of range");
  __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
}

Assistant:

void EAXReverb_setParami(EffectProps *props, ALenum param, int val)
{
    switch(param)
    {
    case AL_EAXREVERB_DECAY_HFLIMIT:
        if(!(val >= AL_EAXREVERB_MIN_DECAY_HFLIMIT && val <= AL_EAXREVERB_MAX_DECAY_HFLIMIT))
            throw effect_exception{AL_INVALID_VALUE, "EAX Reverb decay hflimit out of range"};
        props->Reverb.DecayHFLimit = val != AL_FALSE;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid EAX reverb integer property 0x%04x",
            param};
    }
}